

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

VkResult __thiscall
Fossilize::VulkanDevice::create_sampler_with_ycbcr_remap
          (VulkanDevice *this,VkSamplerCreateInfo *create_info,VkSampler *sampler)

{
  pointer *pppVVar1;
  iterator __position;
  VkResult VVar2;
  VkResult VVar3;
  VkStructureType *pVVar4;
  VkResult unaff_R14D;
  VkSamplerYcbcrConversion conv;
  VkSamplerYcbcrConversionCreateInfo ycbcr;
  VkSamplerYcbcrConversion_T *local_98;
  vector<VkSamplerYcbcrConversion_T*,std::allocator<VkSamplerYcbcrConversion_T*>> *local_90;
  VkSamplerCreateInfo *local_88;
  VkSampler *local_80;
  VkSamplerYcbcrConversionCreateInfo local_78;
  
  local_98 = (VkSamplerYcbcrConversion_T *)0x0;
  pVVar4 = (VkStructureType *)create_info->pNext;
  local_88 = create_info;
  local_80 = sampler;
  if (pVVar4 != (VkStructureType *)0x0) {
    local_90 = (vector<VkSamplerYcbcrConversion_T*,std::allocator<VkSamplerYcbcrConversion_T*>> *)
               &this->ycbcr_conversions;
    do {
      VVar3 = unaff_R14D;
      if (*pVVar4 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
        local_78.sType = *pVVar4;
        local_78._4_4_ = pVVar4[1];
        local_78.format = pVVar4[4];
        local_78.ycbcrModel = pVVar4[5];
        local_78.ycbcrRange = pVVar4[6];
        local_78.components.r = pVVar4[7];
        local_78.components.g = pVVar4[8];
        local_78.components.b = pVVar4[9];
        local_78.components.a = pVVar4[10];
        local_78.xChromaOffset = pVVar4[0xb];
        local_78.yChromaOffset = pVVar4[0xc];
        local_78.chromaFilter = pVVar4[0xd];
        local_78.forceExplicitReconstruction = pVVar4[0xe];
        local_78._60_4_ = pVVar4[0xf];
        local_78.pNext = (void *)0x0;
        VVar2 = (*vkCreateSamplerYcbcrConversionKHR)
                          (this->device,&local_78,(VkAllocationCallbacks *)0x0,&local_98);
        VVar3 = VVar2;
        if (VVar2 == VK_SUCCESS) {
          __position._M_current =
               (this->ycbcr_conversions).
               super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->ycbcr_conversions).
              super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<VkSamplerYcbcrConversion_T*,std::allocator<VkSamplerYcbcrConversion_T*>>::
            _M_realloc_insert<VkSamplerYcbcrConversion_T*const&>(local_90,__position,&local_98);
          }
          else {
            *__position._M_current = local_98;
            pppVVar1 = &(this->ycbcr_conversions).
                        super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppVVar1 = *pppVVar1 + 1;
          }
          *pVVar4 = VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO;
          *(VkSamplerYcbcrConversion_T **)(pVVar4 + 4) = local_98;
          VVar3 = unaff_R14D;
        }
        if (VVar2 != VK_SUCCESS) {
          return VVar3;
        }
      }
      pVVar4 = *(VkStructureType **)(pVVar4 + 2);
      unaff_R14D = VVar3;
    } while (pVVar4 != (VkStructureType *)0x0);
  }
  VVar3 = (*vkCreateSampler)(this->device,local_88,(VkAllocationCallbacks *)0x0,local_80);
  return VVar3;
}

Assistant:

VkResult VulkanDevice::create_sampler_with_ycbcr_remap(const VkSamplerCreateInfo *create_info, VkSampler *sampler)
{
	VkSamplerYcbcrConversion conv = VK_NULL_HANDLE;
	VkResult vr;

	// Kinda hacky. Resolve Ycbcr sampler objects.
	// Replace the create info inline.
	const auto *next = static_cast<const VkBaseInStructure *>(create_info->pNext);
	while (next)
	{
		if (next->sType == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO)
		{
			auto ycbcr = *reinterpret_cast<const VkSamplerYcbcrConversionCreateInfo *>(next);
			ycbcr.pNext = nullptr;

			if ((vr = vkCreateSamplerYcbcrConversionKHR(device, &ycbcr, nullptr, &conv)) != VK_SUCCESS)
				return vr;

			ycbcr_conversions.push_back(conv);

			// Kinda icky, but we know the conversion info is smaller than the create info.
			// It's also safe to mutate the input structs we get from enqueue_create_sampler().
			auto *mut_next = const_cast<VkBaseInStructure *>(next);
			mut_next->sType = VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO;
			reinterpret_cast<VkSamplerYcbcrConversionInfo *>(mut_next)->conversion = conv;
		}

		next = static_cast<const VkBaseInStructure *>(next->pNext);
	}

	if ((vr = vkCreateSampler(device, create_info, nullptr, sampler)) != VK_SUCCESS)
		return vr;

	return VK_SUCCESS;
}